

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O0

bool draco::DecodeTaggedSymbols<draco::RAnsSymbolDecoder>
               (uint32_t num_values,int num_components,DecoderBuffer *src_buffer,
               uint32_t *out_values)

{
  bool bVar1;
  long in_RCX;
  int in_ESI;
  uint in_EDI;
  uint32_t val;
  int j;
  uint32_t bit_length;
  uint32_t i;
  int value_id;
  RAnsSymbolDecoder<5> tag_decoder;
  uint32_t *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff44;
  uint32_t in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 uVar2;
  RAnsSymbolDecoder<5> *this;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff5c;
  int local_a0;
  uint local_98;
  int local_94;
  DecoderBuffer *in_stack_ffffffffffffff80;
  RAnsSymbolDecoder<5> *in_stack_ffffffffffffff88;
  bool local_1;
  
  this = (RAnsSymbolDecoder<5> *)&stack0xffffffffffffff80;
  RAnsSymbolDecoder<5>::RAnsSymbolDecoder(this);
  bVar1 = RAnsSymbolDecoder<5>::Create(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff58);
  if (bVar1) {
    bVar1 = RAnsSymbolDecoder<5>::StartDecoding
                      ((RAnsSymbolDecoder<5> *)CONCAT44(in_stack_ffffffffffffff5c,uVar3),
                       (DecoderBuffer *)this);
    uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
    if (bVar1) {
      if (in_EDI != 0) {
        in_stack_ffffffffffffff48 =
             RAnsSymbolDecoder<5>::num_symbols((RAnsSymbolDecoder<5> *)&stack0xffffffffffffff80);
        if (in_stack_ffffffffffffff48 == 0) {
          local_1 = false;
          goto LAB_0025473d;
        }
      }
      DecoderBuffer::StartBitDecoding
                ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffff5c,uVar3),
                 SUB81((ulong)this >> 0x38,0),(uint64_t *)CONCAT44(uVar2,in_stack_ffffffffffffff48))
      ;
      local_94 = 0;
      for (local_98 = 0; local_98 < in_EDI; local_98 = in_ESI + local_98) {
        in_stack_ffffffffffffff44 =
             RAnsSymbolDecoder<5>::DecodeSymbol((RAnsSymbolDecoder<5> *)0x254675);
        for (local_a0 = 0; local_a0 < in_ESI; local_a0 = local_a0 + 1) {
          bVar1 = DecoderBuffer::DecodeLeastSignificantBits32
                            ((DecoderBuffer *)CONCAT44(uVar2,in_stack_ffffffffffffff48),
                             in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff40 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff40);
          if (!bVar1) {
            local_1 = false;
            goto LAB_0025473d;
          }
          *(undefined4 *)(in_RCX + (long)local_94 * 4) = in_stack_ffffffffffffff5c;
          local_94 = local_94 + 1;
        }
      }
      RAnsSymbolDecoder<5>::EndDecoding((RAnsSymbolDecoder<5> *)0x25471c);
      DecoderBuffer::EndBitDecoding((DecoderBuffer *)this);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
LAB_0025473d:
  RAnsSymbolDecoder<5>::~RAnsSymbolDecoder
            ((RAnsSymbolDecoder<5> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  return local_1;
}

Assistant:

bool DecodeTaggedSymbols(uint32_t num_values, int num_components,
                         DecoderBuffer *src_buffer, uint32_t *out_values) {
  // Decode the encoded data.
  SymbolDecoderT<5> tag_decoder;
  if (!tag_decoder.Create(src_buffer)) {
    return false;
  }

  if (!tag_decoder.StartDecoding(src_buffer)) {
    return false;
  }

  if (num_values > 0 && tag_decoder.num_symbols() == 0) {
    return false;  // Wrong number of symbols.
  }

  // src_buffer now points behind the encoded tag data (to the place where the
  // values are encoded).
  src_buffer->StartBitDecoding(false, nullptr);
  int value_id = 0;
  for (uint32_t i = 0; i < num_values; i += num_components) {
    // Decode the tag.
    const uint32_t bit_length = tag_decoder.DecodeSymbol();
    // Decode the actual value.
    for (int j = 0; j < num_components; ++j) {
      uint32_t val;
      if (!src_buffer->DecodeLeastSignificantBits32(bit_length, &val)) {
        return false;
      }
      out_values[value_id++] = val;
    }
  }
  tag_decoder.EndDecoding();
  src_buffer->EndBitDecoding();
  return true;
}